

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.h
# Opt level: O3

SrcBuffer * __thiscall llvm::SourceMgr::getBufferInfo(SourceMgr *this,uint i)

{
  pointer pSVar1;
  
  if ((i != 0) &&
     (pSVar1 = (this->Buffers).
               super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (ulong)i <=
     (ulong)(((long)(this->Buffers).
                    super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
            -0x5555555555555555))) {
    return pSVar1 + (i - 1);
  }
  __assert_fail("isValidBufferID(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/SourceMgr.h"
                ,0x80,"const SrcBuffer &llvm::SourceMgr::getBufferInfo(unsigned int) const");
}

Assistant:

bool isValidBufferID(unsigned i) const { return i && i <= Buffers.size(); }